

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O0

void vertSyncHandler(void)

{
  int iVar1;
  SDL_Event event;
  Uint32 frametime;
  Uint32 local_40 [15];
  uint local_4;
  
  iVar1 = SDL_GetTicks();
  local_4 = iVar1 - ticks;
  if (vsyncEvent != 0xffffffff) {
    SDL_memset(local_40,0,0x38);
    local_40[0] = vsyncEvent;
    SDL_PushEvent(local_40);
  }
  if (local_4 < 0x10) {
    SDL_Delay(0x10 - local_4);
  }
  ticks = SDL_GetTicks();
  return;
}

Assistant:

void vertSyncHandler(void) {
    Uint32 frametime = SDL_GetTicks() - ticks;

    if (vsyncEvent != ((Uint32) -1)) {
        SDL_Event event;
        SDL_memset(&event, 0, sizeof(event));
        event.type = vsyncEvent;
        SDL_PushEvent(&event);
    }

    if (frametime < idealFrameTime) {
    	SDL_Delay(idealFrameTime - frametime);
    }

    ticks = SDL_GetTicks();
}